

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  pointer pcVar2;
  size_type sVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  FieldDescriptorProto *field;
  OneofDescriptorProto *oneof_decl;
  EnumDescriptorProto *enum_type;
  DescriptorProto *message_00;
  MessageOptions *options;
  size_type __rlen;
  string_view text;
  LocationRecorder location;
  SymbolVisibility visibility;
  LocationRecorder local_58;
  FileDescriptorProto *local_40;
  SymbolVisibility local_34;
  
  text._M_str = ";";
  text._M_len = 1;
  bVar4 = TryConsumeEndOfDeclaration(this,text,(LocationRecorder *)0x0);
  if (bVar4) {
    return true;
  }
  local_34 = VISIBILITY_UNSET;
  pcVar2 = (this->input_->current_).text._M_dataplus._M_p;
  sVar3 = (this->input_->current_).text._M_string_length;
  if (sVar3 == 5) {
    local_34 = VISIBILITY_UNSET;
    iVar5 = bcmp(pcVar2,"local",5);
joined_r0x001fc75b:
    if ((iVar5 == 0) && (bVar4 = ParseVisibility(this,containing_file,&local_34), !bVar4)) {
      return false;
    }
  }
  else if (sVar3 == 6) {
    iVar5 = bcmp(pcVar2,"export",6);
    goto joined_r0x001fc75b;
  }
  __n = (this->input_->current_).text._M_string_length;
  uVar1 = __n - 4;
  local_40 = containing_file;
  if (uVar1 < 7) {
    pcVar2 = (this->input_->current_).text._M_dataplus._M_p;
    switch(uVar1) {
    case 0:
switchD_001fc79d_caseD_0:
      iVar5 = bcmp(pcVar2,"enum",__n);
      if (iVar5 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_58,message_location,4,*(int *)((long)&message->field_0 + 0x40));
        enum_type = (EnumDescriptorProto *)
                    internal::RepeatedPtrFieldBase::AddMessageLite
                              (&(message->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                               Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
        bVar4 = ParseEnumDefinition(this,enum_type,&local_34,&local_58,local_40);
        goto LAB_001fc913;
      }
      switch(__n) {
      case 5:
        goto switchD_001fc79d_caseD_1;
      case 6:
        goto switchD_001fc79d_caseD_2;
      case 8:
        goto switchD_001fc79d_caseD_4;
      case 10:
        goto switchD_001fc79d_caseD_6;
      }
      break;
    case 1:
switchD_001fc79d_caseD_1:
      iVar5 = bcmp(pcVar2,"oneof",__n);
      if (iVar5 == 0) {
        iVar5 = *(int *)((long)&message->field_0 + 0x88);
        LocationRecorder::LocationRecorder(&local_58,message_location,8,iVar5);
        oneof_decl = (OneofDescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::OneofDescriptorProto>);
        bVar4 = ParseOneof(this,oneof_decl,message,iVar5,&local_58,message_location,local_40);
        goto LAB_001fc913;
      }
      break;
    case 2:
switchD_001fc79d_caseD_2:
      iVar5 = bcmp(pcVar2,"extend",__n);
      if (iVar5 == 0) {
        LocationRecorder::LocationRecorder(&local_58,message_location,6);
        bVar4 = ParseExtend(this,&(message->field_0)._impl_.extension_,
                            &(message->field_0)._impl_.nested_type_,message_location,3,&local_58,
                            local_40);
        goto LAB_001fc913;
      }
      if (__n == 5) goto switchD_001fc79d_caseD_1;
      if ((__n == 6) && (iVar5 = bcmp(pcVar2,"option",6), iVar5 == 0)) {
        LocationRecorder::LocationRecorder(&local_58,message_location,7);
        options = DescriptorProto::mutable_options(message);
        bVar4 = ParseOption(this,&options->super_Message,&local_58,local_40,OPTION_STATEMENT);
        goto LAB_001fc913;
      }
      break;
    case 3:
      iVar5 = bcmp(pcVar2,"message",__n);
      if (iVar5 == 0) {
        LocationRecorder::LocationRecorder
                  (&local_58,message_location,3,*(int *)((long)&message->field_0 + 0x28));
        message_00 = (DescriptorProto *)
                     internal::RepeatedPtrFieldBase::AddMessageLite
                               (&(message->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                                Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
        bVar4 = ParseMessageDefinition(this,message_00,&local_34,&local_58,local_40);
        goto LAB_001fc913;
      }
      switch(uVar1) {
      case 0:
        goto switchD_001fc79d_caseD_0;
      case 1:
        goto switchD_001fc79d_caseD_1;
      case 2:
        goto switchD_001fc79d_caseD_2;
      case 4:
        goto switchD_001fc79d_caseD_4;
      case 6:
        goto switchD_001fc79d_caseD_6;
      }
      break;
    case 4:
switchD_001fc79d_caseD_4:
      iVar5 = bcmp(pcVar2,"reserved",__n);
      if (iVar5 == 0) {
        bVar4 = ParseReserved(this,message,message_location);
        return bVar4;
      }
      if (__n == 5) goto switchD_001fc79d_caseD_1;
      if (__n == 6) goto switchD_001fc79d_caseD_2;
      break;
    case 6:
switchD_001fc79d_caseD_6:
      iVar5 = bcmp(pcVar2,"extensions",__n);
      if (iVar5 == 0) {
        LocationRecorder::Init(&local_58,message_location,message_location->source_code_info_);
        RepeatedField<int>::Add(&((local_58.location_)->field_0)._impl_.path_,5);
        bVar4 = ParseExtensions(this,message,&local_58,local_40);
        goto LAB_001fc913;
      }
      if (__n == 5) goto switchD_001fc79d_caseD_1;
      if (__n == 6) goto switchD_001fc79d_caseD_2;
      if (__n == 8) goto switchD_001fc79d_caseD_4;
    }
  }
  LocationRecorder::LocationRecorder
            (&local_58,message_location,2,*(int *)((long)&message->field_0 + 0x10));
  field = (FieldDescriptorProto *)
          internal::RepeatedPtrFieldBase::AddMessageLite
                    (&(message->field_0)._impl_.field_.super_RepeatedPtrFieldBase,
                     Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  bVar4 = ParseMessageField(this,field,&(message->field_0)._impl_.nested_type_,message_location,3,
                            &local_58,local_40);
LAB_001fc913:
  LocationRecorder::~LocationRecorder(&local_58);
  return bVar4;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", nullptr)) {
    // empty statement; ignore
    return true;
  }

  SymbolVisibility visibility = SymbolVisibility::VISIBILITY_UNSET;
  if (LookingAt("export") || LookingAt("local")) {
    DO(ParseVisibility(containing_file, &visibility));
  }

  if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), visibility,
                                  location, containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), visibility, location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(), message_location,
                       DescriptorProto::kNestedTypeFieldNumber, location,
                       containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location, containing_file,
                       OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(
        message_location, DescriptorProto::kOneofDeclFieldNumber, oneof_index);

    return ParseOneof(message->add_oneof_decl(), message, oneof_index,
                      oneof_location, message_location, containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(
        message->add_field(), message->mutable_nested_type(), message_location,
        DescriptorProto::kNestedTypeFieldNumber, location, containing_file);
  }
}